

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall Printer::Print(Printer *this,ostream *c,char *data)

{
  uint uVar1;
  DataAttrInfo *pDVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  char str [53];
  char strSpace [50];
  char local_a8 [64];
  char local_68 [56];
  
  if (data != (char *)0x0) {
    this->iCount = this->iCount + 1;
    if (0 < this->attrCount) {
      lVar6 = 0;
      do {
        pDVar2 = this->attributes;
        if (pDVar2[lVar6].attrType == STRING) {
          local_a8[0x20] = '\0';
          local_a8[0x21] = '\0';
          local_a8[0x22] = '\0';
          local_a8[0x23] = '\0';
          local_a8[0x24] = '\0';
          local_a8[0x25] = '\0';
          local_a8[0x26] = '\0';
          local_a8[0x27] = '\0';
          local_a8[0x28] = '\0';
          local_a8[0x29] = '\0';
          local_a8[0x2a] = '\0';
          local_a8[0x2b] = '\0';
          local_a8[0x2c] = '\0';
          local_a8[0x10] = '\0';
          local_a8[0x11] = '\0';
          local_a8[0x12] = '\0';
          local_a8[0x13] = '\0';
          local_a8[0x14] = '\0';
          local_a8[0x15] = '\0';
          local_a8[0x16] = '\0';
          local_a8[0x17] = '\0';
          local_a8[0x18] = '\0';
          local_a8[0x19] = '\0';
          local_a8[0x1a] = '\0';
          local_a8[0x1b] = '\0';
          local_a8[0x1c] = '\0';
          local_a8[0x1d] = '\0';
          local_a8[0x1e] = '\0';
          local_a8[0x1f] = '\0';
          local_a8[0] = '\0';
          local_a8[1] = '\0';
          local_a8[2] = '\0';
          local_a8[3] = '\0';
          local_a8[4] = '\0';
          local_a8[5] = '\0';
          local_a8[6] = '\0';
          local_a8[7] = '\0';
          local_a8[8] = '\0';
          local_a8[9] = '\0';
          local_a8[10] = '\0';
          local_a8[0xb] = '\0';
          local_a8[0xc] = '\0';
          local_a8[0xd] = '\0';
          local_a8[0xe] = '\0';
          local_a8[0xf] = '\0';
          local_a8[0x2d] = '\0';
          local_a8[0x2e] = '\0';
          local_a8[0x2f] = '\0';
          local_a8[0x30] = '\0';
          local_a8[0x31] = '\0';
          local_a8[0x32] = '\0';
          local_a8[0x33] = '\0';
          local_a8[0x34] = 0;
          if ((long)pDVar2[lVar6].attrLength < 0x36) {
            strncpy(local_a8,data + pDVar2[lVar6].offset,(long)pDVar2[lVar6].attrLength);
            sVar4 = strlen(local_a8);
            std::__ostream_insert<char,std::char_traits<char>>(c,local_a8,sVar4);
            iVar7 = this->attributes[lVar6].attrLength;
            sVar4 = strlen(this->psHeader[lVar6]);
            sVar5 = strlen(local_a8);
            iVar8 = (int)sVar4;
            iVar3 = (int)sVar5;
            if (iVar7 < iVar8) {
              iVar7 = iVar8 - iVar3;
              if (iVar7 != 0 && iVar3 <= iVar8) {
                do {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                  iVar7 = iVar7 + -1;
                } while (iVar7 != 0);
              }
            }
            else {
              iVar8 = iVar7 - iVar3;
              if (iVar8 != 0 && iVar3 <= iVar7) {
                do {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
              }
            }
          }
          else {
            strncpy(local_a8,data + pDVar2[lVar6].offset,0x34);
            local_a8[0x32] = '.';
            local_a8[0x33] = '.';
            sVar4 = strlen(local_a8);
            std::__ostream_insert<char,std::char_traits<char>>(c,local_a8,sVar4);
            sVar4 = strlen(local_a8);
            if ((int)sVar4 < 0x35) {
              iVar7 = (int)sVar4 + -0x35;
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                iVar7 = iVar7 + 1;
              } while (iVar7 != 0);
            }
          }
        }
        if (this->attributes[lVar6].attrType == INT) {
          uVar1 = *(uint *)(data + this->attributes[lVar6].offset);
          sprintf(local_68,"%d",(ulong)uVar1);
          std::ostream::operator<<(c,uVar1);
          sVar4 = strlen(this->psHeader[lVar6]);
          if (sVar4 < 0xc) {
            sVar4 = strlen(local_68);
            if ((int)sVar4 < 0xc) {
              iVar7 = (int)sVar4 + -0xc;
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                iVar7 = iVar7 + 1;
              } while (iVar7 != 0);
            }
          }
          else {
            sVar5 = strlen(local_68);
            iVar7 = (int)sVar4 - (int)sVar5;
            if (iVar7 != 0 && (int)sVar5 <= (int)sVar4) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
          }
        }
        if (this->attributes[lVar6].attrType == FLOAT) {
          sprintf(local_68,"%f",SUB84((double)*(float *)(data + this->attributes[lVar6].offset),0));
          sVar4 = strlen(local_68);
          std::__ostream_insert<char,std::char_traits<char>>(c,local_68,sVar4);
          sVar4 = strlen(this->psHeader[lVar6]);
          if (sVar4 < 0xc) {
            sVar4 = strlen(local_68);
            if ((int)sVar4 < 0xc) {
              iVar7 = (int)sVar4 + -0xc;
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                iVar7 = iVar7 + 1;
              } while (iVar7 != 0);
            }
          }
          else {
            sVar5 = strlen(local_68);
            iVar7 = (int)sVar4 - (int)sVar5;
            if (iVar7 != 0 && (int)sVar5 <= (int)sVar4) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->attrCount);
    }
    std::__ostream_insert<char,std::char_traits<char>>(c,"\n",1);
  }
  return;
}

Assistant:

void Printer::Print(ostream &c, const char * const data)
{
    char str[MAXPRINTSTRING], strSpace[50];
    int i, a;
    float b;

    if (data == NULL)
        return;

    // Increment the number of tuples printed
    iCount++;

    for (i = 0; i<attrCount; i++) {
        if (attributes[i].attrType == STRING) {
            // We will only print out the first MAXNAME+10 characters of
            // the string value.
            memset(str,0,MAXPRINTSTRING);

            if (attributes[i].attrLength>MAXPRINTSTRING) {
                strncpy(str, data+attributes[i].offset, MAXPRINTSTRING-1);
                str[MAXPRINTSTRING-3] ='.';
                str[MAXPRINTSTRING-2] ='.';
                c << str;
                Spaces(MAXPRINTSTRING, strlen(str));
            } else {
                strncpy(str, data+attributes[i].offset, attributes[i].attrLength);
                c << str;
                if (attributes[i].attrLength < (int) strlen(psHeader[i]))
                    Spaces(strlen(psHeader[i]), strlen(str));
                else
                    Spaces(attributes[i].attrLength, strlen(str));
            }
        }
        if (attributes[i].attrType == INT) {
            memcpy (&a, (data+attributes[i].offset), sizeof(int));
            sprintf(strSpace, "%d",a);
            c << a;
            if (strlen(psHeader[i]) < 12)
                Spaces(12, strlen(strSpace));
            else
                Spaces(strlen(psHeader[i]), strlen(strSpace));
        }
        if (attributes[i].attrType == FLOAT) {
            memcpy (&b, (data+attributes[i].offset), sizeof(float));
            sprintf(strSpace, "%f",b);
            c << strSpace;
            if (strlen(psHeader[i]) < 12)
                Spaces(12, strlen(strSpace));
            else
                Spaces(strlen(psHeader[i]), strlen(strSpace));
        }
    }
    c << "\n";
}